

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_true,_false>::unfix_
          (DaTrie<false,_true,_false> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  Bc BVar2;
  pointer pBVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = (ulong)node_pos;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) <= uVar4) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x449,
                  "void ddd::DaTrie<false, true, false>::unfix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = true, Prefix = false]"
                 );
  }
  BVar2 = pBVar1[uVar4];
  if ((long)BVar2 < 0) {
    uVar6 = node_pos >> 8;
    if (this->bc_emps_ == 0) {
      pBVar1[uVar4] = (Bc)((ulong)BVar2 & 0xffffffff00000000 | (ulong)(node_pos & 0x7fffffff));
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar1[uVar4] =
           (Bc)((ulong)pBVar1[uVar4] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20);
      this->head_pos_ = node_pos;
    }
    else {
      pBVar1[uVar4] =
           (Bc)((ulong)BVar2 & 0x80000000ffffffff |
               (ulong)pBVar1[this->head_pos_] & 0x7fffffff00000000);
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar1[uVar4] =
           (Bc)((ulong)(this->head_pos_ & 0x7fffffff) | (ulong)pBVar1[uVar4] & 0xffffffff00000000);
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (ulong)pBVar1[this->head_pos_] >> 0x1d & 0x3fffffff8;
      *(ulong *)(&pBVar1->field_0x0 + uVar7) =
           *(ulong *)(&pBVar1->field_0x0 + uVar7) & 0xffffffff00000000 |
           (ulong)(node_pos & 0x7fffffff);
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar1[this->head_pos_] =
           (Bc)((ulong)pBVar1[this->head_pos_] & 0x80000000ffffffff |
               (ulong)(node_pos & 0x7fffffff) << 0x20);
    }
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start + uVar4;
    *pBVar1 = (Bc)((ulong)*pBVar1 & 0x7fffffffffffffff);
    this->bc_emps_ = this->bc_emps_ + 1;
    pBVar3 = (blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = pBVar3[uVar6].num_emps + 1;
    pBVar3[uVar6].num_emps = uVar5;
    if (uVar5 == 0x100 &&
        (int)((ulong)((long)(this->blocks_).
                            super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->blocks_).
                           super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - 1U == uVar6) {
      do {
        uVar6 = uVar6 - 1;
        pop_block_(this);
        if ((int)((ulong)((long)(this->blocks_).
                                super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->blocks_).
                               super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) == 0) {
          return;
        }
      } while ((blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6].num_emps == 0x100);
    }
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x44a,
                "void ddd::DaTrie<false, true, false>::unfix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<Block>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (bc_emps_ == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      head_pos_ = node_pos;
    } else {
      set_prev_(node_pos, prev_(head_pos_));
      set_next_(node_pos, head_pos_);
      set_next_(prev_(head_pos_), node_pos);
      set_prev_(head_pos_, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }